

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStreamComponent_Initialize
                  (PaAlsaStreamComponent *self,PaAlsaHostApiRepresentation *alsaApi,
                  PaStreamParameters *params,StreamDirection streamDir,int callbackMode)

{
  int *piVar1;
  PaSampleFormat format;
  void *pvVar2;
  PaDeviceInfo *pPVar3;
  int iVar4;
  uint uVar5;
  snd_pcm_format_t sVar6;
  PaSampleFormat PVar7;
  void **ppvVar8;
  int iVar9;
  int *piVar10;
  PaError PVar11;
  char *format_00;
  bool bVar12;
  
  if (params->channelCount < 1) {
    __assert_fail("params->channelCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x754,
                  "PaError PaAlsaStreamComponent_Initialize(PaAlsaStreamComponent *, PaAlsaHostApiRepresentation *, const PaStreamParameters *, StreamDirection, int)"
                 );
  }
  format = params->sampleFormat;
  piVar1 = &params->channelCount;
  *(undefined8 *)&self->streamDir = 0;
  self->channelAreas = (snd_pcm_channel_area_t *)0x0;
  self->userBuffers = (void **)0x0;
  self->offset = 0;
  self->nativeFormat = SND_PCM_FORMAT_S8;
  self->nfds = 0;
  *(undefined8 *)&self->ready = 0;
  self->framesPerPeriod = 0;
  self->alsaBufferSize = 0;
  self->deviceIsPlug = 0;
  self->useReventFix = 0;
  self->pcm = (snd_pcm_t *)0x0;
  self->nonMmapBuffer = (void *)0x0;
  self->nonMmapBufferSize = 0;
  self->device = 0;
  self->userInterleaved = 0;
  self->hostInterleaved = 0;
  *(undefined8 *)&self->canMmap = 0;
  self->hostSampleFormat = 0;
  self->numUserChannels = 0;
  self->numHostChannels = 0;
  pvVar2 = params->hostApiSpecificStreamInfo;
  if (pvVar2 == (void *)0x0) {
    pPVar3 = (alsaApi->baseHostApiRep).deviceInfos[params->device];
    piVar10 = (int *)((long)&pPVar3[1].name + (ulong)(streamDir != StreamDirection_In) * 4 + 4);
    if (*piVar10 < params->channelCount) {
      piVar10 = piVar1;
    }
    self->numHostChannels = *piVar10;
    iVar9 = *(int *)&pPVar3[1].name;
LAB_001114a5:
    self->deviceIsPlug = iVar9;
  }
  else {
    self->numHostChannels = *piVar1;
    iVar4 = strncmp("hw:",*(char **)((long)pvVar2 + 0x18),3);
    iVar9 = 1;
    if (iVar4 != 0) goto LAB_001114a5;
  }
  if ((self->deviceIsPlug != 0) && (alsaApi->alsaLibVersion < 0x10010)) {
    self->useReventFix = 1;
  }
  self->device = params->device;
  paUtilErr_ = AlsaOpen(&alsaApi->baseHostApiRep,params,streamDir,&self->pcm);
  if (paUtilErr_ < 0) {
    format_00 = 
    "Expression \'AlsaOpen( &alsaApi->baseHostApiRep, params, streamDir, &self->pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1902\n"
    ;
    PVar7 = 0;
  }
  else {
    uVar5 = snd_pcm_poll_descriptors_count(self->pcm);
    self->nfds = uVar5;
    PVar7 = GetAvailableFormats(self->pcm);
    PVar7 = PaUtil_SelectClosestAvailableFormat(PVar7,format);
    paUtilErr_ = (PaError)PVar7;
    if (-1 < paUtilErr_) {
      self->hostSampleFormat = PVar7;
      sVar6 = Pa2AlsaFormat(PVar7);
      self->nativeFormat = sVar6;
      bVar12 = -1 < (int)format;
      uVar5 = (uint)bVar12;
      self->userInterleaved = uVar5;
      self->hostInterleaved = uVar5;
      iVar9 = *piVar1;
      self->numUserChannels = iVar9;
      self->streamDir = streamDir;
      self->canMmap = 0;
      self->nonMmapBuffer = (void *)0x0;
      self->nonMmapBufferSize = 0;
      PVar11 = 0;
      if (!bVar12 && callbackMode == 0) {
        ppvVar8 = (void **)PaUtil_AllocateMemory((long)iVar9 << 3);
        self->userBuffers = ppvVar8;
        PVar11 = 0;
        if (ppvVar8 == (void **)0x0) {
          PaUtil_DebugPrint(
                           "Expression \'self->userBuffers = PaUtil_AllocateMemory( sizeof (void *) * self->numUserChannels )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1920\n"
                           );
          PVar11 = -0x2708;
        }
      }
      goto LAB_00111574;
    }
    format_00 = 
    "Expression \'hostSampleFormat = PaUtil_SelectClosestAvailableFormat( GetAvailableFormats( self->pcm ), userSampleFormat )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1905\n"
    ;
  }
  PaUtil_DebugPrint(format_00);
  PVar11 = paUtilErr_;
LAB_00111574:
  if (PVar7 == 0xffffffffffffd8f6) {
    LogAllAvailableFormats(self->pcm);
  }
  return PVar11;
}

Assistant:

static PaError PaAlsaStreamComponent_Initialize( PaAlsaStreamComponent *self, PaAlsaHostApiRepresentation *alsaApi,
        const PaStreamParameters *params, StreamDirection streamDir, int callbackMode )
{
    PaError result = paNoError;
    PaSampleFormat userSampleFormat = params->sampleFormat, hostSampleFormat = paNoError;
    assert( params->channelCount > 0 );

    /* Make sure things have an initial value */
    memset( self, 0, sizeof (PaAlsaStreamComponent) );

    if( NULL == params->hostApiSpecificStreamInfo )
    {
        const PaAlsaDeviceInfo *devInfo = GetDeviceInfo( &alsaApi->baseHostApiRep, params->device );
        self->numHostChannels = PA_MAX( params->channelCount, StreamDirection_In == streamDir ? devInfo->minInputChannels
                : devInfo->minOutputChannels );
        self->deviceIsPlug = devInfo->isPlug;
        PA_DEBUG(( "%s: Host Chans %c %i\n", __FUNCTION__, streamDir == StreamDirection_In ? 'C' : 'P', self->numHostChannels ));
    }
    else
    {
        /* We're blissfully unaware of the minimum channelCount */
        self->numHostChannels = params->channelCount;
        /* Check if device name does not start with hw: to determine if it is a 'plug' device */
        if( strncmp( "hw:", ((PaAlsaStreamInfo *)params->hostApiSpecificStreamInfo)->deviceString, 3 ) != 0  )
            self->deviceIsPlug = 1; /* An Alsa plug device, not a direct hw device */
    }
    if( self->deviceIsPlug && alsaApi->alsaLibVersion < ALSA_VERSION_INT( 1, 0, 16 ) )
        self->useReventFix = 1; /* Prior to Alsa1.0.16, plug devices may stutter without this fix */

    self->device = params->device;

    PA_ENSURE( AlsaOpen( &alsaApi->baseHostApiRep, params, streamDir, &self->pcm ) );
    self->nfds = alsa_snd_pcm_poll_descriptors_count( self->pcm );

    PA_ENSURE( hostSampleFormat = PaUtil_SelectClosestAvailableFormat( GetAvailableFormats( self->pcm ), userSampleFormat ) );

    self->hostSampleFormat = hostSampleFormat;
    self->nativeFormat = Pa2AlsaFormat( hostSampleFormat );
    self->hostInterleaved = self->userInterleaved = !( userSampleFormat & paNonInterleaved );
    self->numUserChannels = params->channelCount;
    self->streamDir = streamDir;
    self->canMmap = 0;
    self->nonMmapBuffer = NULL;
    self->nonMmapBufferSize = 0;

    if( !callbackMode && !self->userInterleaved )
    {
        /* Pre-allocate non-interleaved user provided buffers */
        PA_UNLESS( self->userBuffers = PaUtil_AllocateMemory( sizeof (void *) * self->numUserChannels ),
                paInsufficientMemory );
    }

error:

    /* Log all available formats. */
    if ( hostSampleFormat == paSampleFormatNotSupported )
    {
        LogAllAvailableFormats( self->pcm );
        PA_DEBUG(( "%s: Please provide the log output to PortAudio developers, your hardware does not have any sample format implemented yet.\n", __FUNCTION__ ));
    }

    return result;
}